

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_val_t * mpcf_re_and(int n,mpc_val_t **xs)

{
  mpc_parser_t *pmVar1;
  ulong uVar2;
  
  pmVar1 = mpc_lift(mpcf_ctor_str);
  if (n < 1) {
    n = 0;
  }
  for (uVar2 = 0; (uint)n != uVar2; uVar2 = uVar2 + 1) {
    pmVar1 = mpc_and(2,mpcf_strfold,pmVar1,xs[uVar2],free);
  }
  return pmVar1;
}

Assistant:

static mpc_val_t *mpcf_re_and(int n, mpc_val_t **xs) {
  int i;
  mpc_parser_t *p = mpc_lift(mpcf_ctor_str);
  for (i = 0; i < n; i++) {
    p = mpc_and(2, mpcf_strfold, p, xs[i], free);
  }
  return p;
}